

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

Cbs2_Man_t * Cbs2_ManAlloc(Gia_Man_t *pGia)

{
  Cbs2_Man_t *pPars;
  int *piVar1;
  Vec_Int_t *pVVar2;
  
  pPars = (Cbs2_Man_t *)calloc(1,400);
  (pPars->pClauses).nSize = 10000;
  (pPars->pJust).nSize = 10000;
  (pPars->pProp).nSize = 10000;
  piVar1 = (int *)malloc(40000);
  (pPars->pProp).pData = piVar1;
  piVar1 = (int *)malloc(40000);
  (pPars->pJust).pData = piVar1;
  piVar1 = (int *)malloc(40000);
  (pPars->pClauses).pData = piVar1;
  (pPars->pClauses).iHead = 1;
  (pPars->pClauses).iTail = 1;
  pVVar2 = Vec_IntAlloc(1000);
  pPars->vModel = pVVar2;
  pVVar2 = Vec_IntAlloc(1000);
  pPars->vTemp = pVVar2;
  pPars->pAig = pGia;
  Cbs2_SetDefaultParams((Cbs2_Par_t *)pPars);
  Vec_StrFill(&pPars->vAssign,pGia->nObjs,'\x02');
  Vec_StrFill(&pPars->vMark,pGia->nObjs,'\0');
  Vec_IntFill(&pPars->vLevReason,pGia->nObjs * 3,-1);
  Vec_IntFill(&pPars->vWatches,pGia->nObjs * 2,0);
  Vec_IntFill(&pPars->vFanout0,pGia->nObjs,0);
  Vec_IntFill(&pPars->vFanoutN,pGia->nObjs * 2,0);
  Vec_IntFill(&pPars->vActivity,pGia->nObjs,0);
  Vec_IntGrow(&pPars->vActStore,1000);
  Vec_IntGrow(&pPars->vJStore,1000);
  Vec_IntGrow(&pPars->vWatchUpds,1000);
  return pPars;
}

Assistant:

Cbs2_Man_t * Cbs2_ManAlloc( Gia_Man_t * pGia )
{
    Cbs2_Man_t * p;
    p = ABC_CALLOC( Cbs2_Man_t, 1 );
    p->pProp.nSize = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData = ABC_ALLOC( int, p->pProp.nSize );
    p->pJust.pData = ABC_ALLOC( int, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( int, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel   = Vec_IntAlloc( 1000 );
    p->vTemp    = Vec_IntAlloc( 1000 );
    p->pAig     = pGia;
    Cbs2_SetDefaultParams( &p->Pars );
    Vec_StrFill( &p->vAssign,    Gia_ManObjNum(pGia), 2 );
    Vec_StrFill( &p->vMark,      Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vLevReason, 3*Gia_ManObjNum(pGia), -1 );
    Vec_IntFill( &p->vWatches,   2*Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vFanout0,   Gia_ManObjNum(pGia),   0 );
    Vec_IntFill( &p->vFanoutN,   2*Gia_ManObjNum(pGia), 0 );
    Vec_IntFill( &p->vActivity,  Gia_ManObjNum(pGia), 0 );
    Vec_IntGrow( &p->vActStore,  1000 );
    Vec_IntGrow( &p->vJStore,    1000 );
    Vec_IntGrow( &p->vWatchUpds, 1000 );
    return p;
}